

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

bool __thiscall SQArray::Insert(SQArray *this,SQInteger idx,SQObject *val)

{
  SQObject *idx_00;
  SQUnsignedInteger SVar1;
  SQObjectPtr local_38;
  SQObject *local_28;
  SQObject *val_local;
  SQInteger idx_local;
  SQArray *this_local;
  
  if ((-1 < idx) &&
     (local_28 = val, val_local = (SQObject *)idx, idx_local = (SQInteger)this,
     SVar1 = sqvector<SQObjectPtr>::size(&this->_values), idx_00 = val_local, idx <= (long)SVar1)) {
    ::SQObjectPtr::SQObjectPtr(&local_38,local_28);
    sqvector<SQObjectPtr>::insert(&this->_values,(SQUnsignedInteger)idx_00,&local_38);
    ::SQObjectPtr::~SQObjectPtr(&local_38);
    return true;
  }
  return false;
}

Assistant:

bool Insert(SQInteger idx,const SQObject &val){
        if(idx < 0 || idx > (SQInteger)_values.size())
            return false;
        _values.insert(idx,val);
        return true;
    }